

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffcdel(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ndelete,LONGLONG bytepos,
          int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long firstrow;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long nchars;
  long lVar7;
  long lVar8;
  long lVar9;
  uchar buffer [10000];
  uchar local_2748 [10008];
  
  iVar1 = *status;
  if (naxis2 != 0 && iVar1 < 1) {
    nchars = naxis1 - ndelete;
    if (nchars < 0x2711) {
      lVar7 = bytepos + ndelete + 1;
      if (1 < naxis2) {
        lVar4 = 1;
        do {
          ffgtbb(fptr,lVar4,lVar7,nchars,local_2748,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,lVar4,bytepos + 1,nchars,local_2748,status);
          fptr->Fptr->rowlength = naxis1;
          lVar4 = lVar4 + 1;
        } while (naxis2 != lVar4);
      }
      lVar4 = naxis1 - (ndelete + bytepos);
      if (0 < lVar4) {
        ffgtbb(fptr,naxis2,lVar7,lVar4,local_2748,status);
        fptr->Fptr->rowlength = nchars;
        ffptbb(fptr,naxis2,bytepos + 1,lVar4,local_2748,status);
        fptr->Fptr->rowlength = naxis1;
      }
    }
    else {
      if (1 < naxis2) {
        uVar5 = (nchars + 9999U) / 10000;
        lVar2 = bytepos + ndelete + 1;
        lVar3 = uVar5 * -10000 + nchars + 10000;
        lVar6 = uVar5 + (uVar5 == 0);
        firstrow = 1;
        lVar7 = lVar3;
        lVar4 = lVar6;
        lVar8 = bytepos + 1;
        lVar9 = lVar2;
        do {
          do {
            ffgtbb(fptr,firstrow,lVar9,lVar7,local_2748,status);
            fptr->Fptr->rowlength = nchars;
            ffptbb(fptr,firstrow,lVar8,lVar7,local_2748,status);
            fptr->Fptr->rowlength = naxis1;
            lVar8 = lVar8 + lVar7;
            lVar9 = lVar9 + lVar7;
            lVar4 = lVar4 + -1;
            lVar7 = 10000;
          } while (lVar4 != 0);
          firstrow = firstrow + 1;
          lVar7 = lVar3;
          lVar4 = lVar6;
          lVar8 = bytepos + 1;
          lVar9 = lVar2;
        } while (firstrow != naxis2);
      }
      lVar7 = (naxis1 - ndelete) - bytepos;
      if (0 < lVar7) {
        uVar5 = (lVar7 + 9999U) / 10000;
        lVar9 = lVar7 + uVar5 * -10000 + 10000;
        lVar8 = bytepos + ndelete + 1;
        lVar4 = bytepos + 1;
        lVar7 = uVar5 + (uVar5 == 0);
        do {
          ffgtbb(fptr,naxis2,lVar8,lVar9,local_2748,status);
          fptr->Fptr->rowlength = nchars;
          ffptbb(fptr,naxis2,lVar4,lVar9,local_2748,status);
          fptr->Fptr->rowlength = naxis1;
          lVar4 = lVar4 + lVar9;
          lVar8 = lVar8 + lVar9;
          lVar9 = 10000;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcdel(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ndelete,    /* I - number of bytes to delete in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to delete bytes     */
           int *status)     /* IO - error status                            */
/*
 delete 'ndelete' bytes from each row of the table at position 'bytepos'.  */
{
    unsigned char buffer[10000];
    LONGLONG i1, i2, ii, irow, nseg;
    LONGLONG newlen, remain, nbytes;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    newlen = naxis1 - ndelete;

    if (newlen <= 10000)
    {
      /*******************************************************************
      CASE #1: optimal case where whole new row fits in the work buffer
      *******************************************************************/
      i1 = bytepos + 1;
      i2 = i1 + ndelete;
      for (irow = 1; irow < naxis2; irow++)
      {
        ffgtbb(fptr, irow, i2, newlen, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, irow, i1, newlen, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }

      /* now do the last row */
      remain = naxis1 - (bytepos + ndelete);

      if (remain > 0)
      {
        ffgtbb(fptr, naxis2, i2, remain, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, naxis2, i1, remain, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************/

        nseg = (newlen + 9999) / 10000;
        for (irow = 1; irow < naxis2; irow++)
        {
          i1 = bytepos + 1;
          i2 = i1 + ndelete;

          nbytes = newlen - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, irow, i2, nbytes, buffer, status); /* read bytes */
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, irow, i1, nbytes, buffer, status); /* rewrite bytes */
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }

        /* now do the last row */
        remain = naxis1 - (bytepos + ndelete);

        if (remain > 0)
        {
          nseg = (remain + 9999) / 10000;
          i1 = bytepos + 1;
          i2 = i1 + ndelete;
          nbytes = remain - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, naxis2, i2, nbytes, buffer, status);
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, naxis2, i1, nbytes, buffer, status); /* write row */
            (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }
    }
    return(*status);
}